

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::getTrackCountAsType1(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  MidiEvent *pMVar3;
  size_type sVar4;
  int local_20;
  int local_1c;
  int i;
  int output;
  MidiFile *this_local;
  
  iVar1 = getTrackState(this);
  if (iVar1 == 1) {
    local_1c = 0;
    local_20 = 0;
    while( true ) {
      ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      iVar1 = MidiEventList::size(*ppMVar2);
      if (iVar1 <= local_20) break;
      pMVar3 = getEvent(this,0,local_20);
      if (local_1c < pMVar3->track) {
        pMVar3 = getEvent(this,0,local_20);
        local_1c = pMVar3->track;
      }
      local_20 = local_20 + 1;
    }
    this_local._4_4_ = local_1c + 1;
  }
  else {
    sVar4 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::size
                      (&this->m_events);
    this_local._4_4_ = (int)sVar4;
  }
  return this_local._4_4_;
}

Assistant:

int MidiFile::getTrackCountAsType1(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		int output = 0;
		int i;
		for (i=0; i<(int)m_events[0]->size(); i++) {
			if (getEvent(0,i).track > output) {
				output = getEvent(0,i).track;
			}
		}
		return output+1;  // I think the track values are 0 offset...
	} else {
		return (int)m_events.size();
	}
}